

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hblas2.cxx
# Opt level: O2

void HBLAS2::hblas2_gemv_square_LDSame<HAXX::quaternion<double>,double,(char)67>(void)

{
  double *pdVar1;
  quaternion<double> ALPHA_00;
  ostream *poVar2;
  basic_ostream<char,_std::char_traits<char>_> *pbVar3;
  long lVar4;
  long lVar5;
  quaternion<double> *x;
  pointer pqVar6;
  pointer pqVar7;
  result_type_conflict1 rVar8;
  result_type_conflict1 rVar9;
  result_type_conflict1 rVar10;
  result_type_conflict1 rVar11;
  double BETA;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> Y;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> X;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> A;
  quaternion<double> local_308;
  quaternion<double> local_2e8;
  undefined1 local_2c8 [8];
  undefined8 local_2c0;
  shared_count sStack_2b8;
  char *local_2b0;
  char *local_2a8;
  char *local_2a0;
  char *local_298;
  undefined1 *local_290;
  undefined1 *local_288;
  char *local_280;
  char *local_278;
  vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_> YC;
  undefined **local_258;
  undefined1 local_250;
  undefined8 *local_248;
  char **local_240;
  quaternion<double> __r;
  quaternion<double> ALPHA;
  quaternion<double> local_1f8;
  quaternion<double> local_1d8;
  stringstream ss;
  ostream local_1a8 [376];
  
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&A,10000,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&X,100,(allocator_type *)&ss);
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector
            (&Y,100,(allocator_type *)&ss);
  for (pqVar7 = X.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      pqVar6 = Y.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,
      pqVar7 != X.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar7 = pqVar7 + 1) {
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar9 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar10 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar11 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar7->_M_real = rVar8;
    pqVar7->_M_imag_i = rVar9;
    pqVar7->_M_imag_j = rVar10;
    pqVar7->_M_imag_k = rVar11;
  }
  for (; pqVar7 = A.
                  super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start,
      pqVar6 != Y.
                super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                ._M_impl.super__Vector_impl_data._M_finish; pqVar6 = pqVar6 + 1) {
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar9 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar10 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar11 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar6->_M_real = rVar8;
    pqVar6->_M_imag_i = rVar9;
    pqVar6->_M_imag_j = rVar10;
    pqVar6->_M_imag_k = rVar11;
  }
  for (; pqVar7 != A.
                   super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish; pqVar7 = pqVar7 + 1) {
    rVar8 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar9 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar10 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    rVar11 = std::uniform_real_distribution<double>::operator()(&dis,&gen);
    pqVar7->_M_real = rVar8;
    pqVar7->_M_imag_i = rVar9;
    pqVar7->_M_imag_j = rVar10;
    pqVar7->_M_imag_k = rVar11;
  }
  std::vector<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::vector(&YC,&Y);
  genRandom<HAXX::quaternion<double>>();
  BETA = genRandom<double>();
  std::__cxx11::stringstream::stringstream((stringstream *)&ss);
  poVar2 = std::operator<<(local_1a8,"hblas2_gemv_square_");
  std::operator<<(poVar2,'C');
  std::operator<<(local_1a8,"Q");
  std::operator<<(local_1a8,"R");
  std::operator<<(local_1a8,"_LDSame");
  std::__cxx11::stringbuf::str();
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)&local_308);
  poVar2 = std::operator<<(poVar2," will use");
  std::endl<char,std::char_traits<char>>(poVar2);
  std::__cxx11::string::~string((string *)&local_308);
  poVar2 = std::operator<<((ostream *)&std::cout,"  ALPHA = ");
  pbVar3 = HAXX::operator<<(poVar2,&ALPHA);
  std::endl<char,std::char_traits<char>>(pbVar3);
  std::operator<<((ostream *)&std::cout,"  BETA = ");
  poVar2 = std::ostream::_M_insert<double>(BETA);
  std::endl<char,std::char_traits<char>>(poVar2);
  ALPHA_00._M_imag_i = ALPHA._M_imag_i;
  ALPHA_00._M_real = ALPHA._M_real;
  ALPHA_00._M_imag_j = ALPHA._M_imag_j;
  ALPHA_00._M_imag_k = ALPHA._M_imag_k;
  HAXX::
  HBLAS_GEMV<double,HAXX::quaternion<double>,HAXX::quaternion<double>,HAXX::quaternion<double>,double>
            ('C',100,100,ALPHA_00,
             A.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,100,
             X.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1,BETA,
             Y.
             super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
             ._M_impl.super__Vector_impl_data._M_start,1);
  lVar5 = 0;
  for (lVar4 = 0; lVar4 != 320000; lVar4 = lVar4 + 0xc80) {
    local_308._M_real = 0.0;
    local_308._M_imag_i = 0.0;
    local_308._M_imag_j = 0.0;
    local_308._M_imag_k = 0.0;
    HAXX::HBLAS_DOTCV<double>
              (&local_2e8,100,
               (quaternion<double> *)
               ((long)&(A.
                        super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                        ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar4),1,
               X.
               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               ._M_impl.super__Vector_impl_data._M_start,1);
    local_290 = &boost::unit_test::basic_cstring<char_const>::null;
    local_288 = &boost::unit_test::basic_cstring<char_const>::null;
    local_280 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_278 = "";
    local_308._M_real = local_2e8._M_real;
    local_308._M_imag_i = local_2e8._M_imag_i;
    local_308._M_imag_j = local_2e8._M_imag_j;
    local_308._M_imag_k = local_2e8._M_imag_k;
    boost::unit_test::unit_test_log_t::set_checkpoint
              (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_280,0x47,&local_290);
    HAXX::operator*(&local_1f8,&ALPHA,&local_308);
    pdVar1 = (double *)
             ((long)&(YC.
                      super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar5);
    __r._M_real = BETA * *pdVar1 + local_1f8._M_real;
    __r._M_imag_i = BETA * pdVar1[1] + local_1f8._M_imag_i;
    __r._M_imag_j = BETA * pdVar1[2] + local_1f8._M_imag_j;
    __r._M_imag_k = BETA * pdVar1[3] + local_1f8._M_imag_k;
    HAXX::inv<double>(&local_1d8,
                      (quaternion<double> *)
                      ((long)&(Y.
                               super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
                               ._M_impl.super__Vector_impl_data._M_start)->_M_real + lVar5));
    HAXX::operator*(&local_2e8,&__r,&local_1d8);
    auVar12._8_8_ = 0;
    auVar12._0_8_ = local_2e8._M_imag_i;
    auVar13._8_8_ = 0;
    auVar13._0_8_ = local_2e8._M_imag_j;
    auVar14._8_8_ = 0;
    auVar14._0_8_ = local_2e8._M_imag_k;
    local_250 = 0;
    auVar15._8_8_ = 0;
    auVar15._0_8_ = (local_2e8._M_real + -1.0) * (local_2e8._M_real + -1.0);
    auVar12 = vfmadd231sd_fma(auVar15,auVar12,auVar12);
    auVar12 = vfmadd231sd_fma(auVar12,auVar13,auVar13);
    auVar12 = vfmadd231sd_fma(auVar12,auVar14,auVar14);
    auVar12 = vsqrtsd_avx(auVar12,auVar12);
    local_2c8[0] = auVar12._0_8_ < 1e-12;
    local_2c0 = 0;
    sStack_2b8.pi_ = (sp_counted_base *)0x0;
    local_2a0 = "( HAXX::norm(((ALPHA*tmp + BETA*YC[i]) * HAXX::inv(Y[i]))- 1.) < 1e-12 )";
    local_298 = "";
    local_258 = &PTR__lazy_ostream_00219908;
    local_248 = &boost::unit_test::lazy_ostream::inst;
    local_240 = &local_2a0;
    local_2b0 = 
    "/workspace/llm4binary/github/license_c_cmakelists/wavefunction91[P]HAXX/tests/hblas2.cxx";
    local_2a8 = "";
    boost::test_tools::tt_detail::report_assertion(local_2c8,&local_258,&local_2b0,0x47,1,0,0);
    boost::detail::shared_count::~shared_count(&sStack_2b8);
    lVar5 = lVar5 + 0x20;
  }
  std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&YC.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&Y.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&X.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  std::_Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>::
  ~_Vector_base(&A.
                 super__Vector_base<HAXX::quaternion<double>,_std::allocator<HAXX::quaternion<double>_>_>
               );
  return;
}

Assistant:

void hblas2_gemv_square_LDSame() {

  // Random Quaternion vectors and matricies
  std::vector<HAXX::quaternion<double>> 
    A(HBLAS2_MATLEN), X(HBLAS1_VECLEN), Y(HBLAS1_VECLEN);

  for(auto &x : X) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : Y) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));
  for(auto &x : A) 
    x = HAXX::quaternion<double>(dis(gen),dis(gen),dis(gen),dis(gen));

  std::vector<HAXX::quaternion<double>> YC(Y);

  _AlphaF ALPHA = genRandom<_AlphaF>();
  _BetaF  BETA = genRandom<_BetaF>();

  std::stringstream ss;

  ss << "hblas2_gemv_square_" << _TA;
  if(std::is_same<double,_AlphaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_AlphaF>::value) ss << "C";
  else ss << "Q";
  if(std::is_same<double,_BetaF>::value) ss << "R";
  else if(std::is_same<std::complex<double>,_BetaF>::value) ss << "C";
  else ss << "Q";
  ss << "_LDSame";

  std::cout << ss.str() << " will use" << std::endl;
  std::cout << "  ALPHA = " << ALPHA << std::endl;
  std::cout << "  BETA = " << BETA << std::endl;

  HBLAS_GEMV(_TA,HBLAS1_VECLEN,HBLAS1_VECLEN,ALPHA,&A[0],HBLAS1_VECLEN,&X[0],1,
    BETA,&Y[0],1);

  for(int i = 0; i < HBLAS1_VECLEN; i++) {
    HAXX_INT AROW = 0;
    HAXX_INT ACOL = i;
    HAXX_INT AStride = 1;
    if( _TA == 'N' ) {
      AROW = i;
      ACOL = 0;
      AStride = HBLAS1_VECLEN;
    }

    HAXX::quaternion<double> tmp;
    if( _TA == 'C' )
      tmp = HBLAS_DOTCV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);
    else
      tmp = HBLAS_DOTUV(HBLAS1_VECLEN,&A[RANK2_INDX(AROW,ACOL,HBLAS1_VECLEN)],
          AStride,&X[0],1);

    BOOST_CHECK(CMP_Q(ALPHA*tmp + BETA*YC[i],Y[i]));
  }

}